

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_icu::utf8_converter_impl::convert_abi_cxx11_
          (utf8_converter_impl *this,conversion_type how,char *begin,char *end,int flags)

{
  char *in_RCX;
  int in_EDX;
  icu_std_converter<char,_1> *in_RDI;
  long in_R8;
  raii_casemap map;
  UnicodeString str;
  icu_std_converter<char,_1> cvt;
  undefined8 in_stack_fffffffffffffef0;
  cpcvt_type cvt_type;
  string *charset;
  icu_std_converter<char,_1> *piVar1;
  string *in_stack_ffffffffffffff18;
  raii_casemap *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  UnicodeString *in_stack_ffffffffffffff30;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff38;
  allocator<char> local_81;
  string local_80 [16];
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  _func_int_UCaseMap_ptr_char_ptr_int_char_ptr_int_UErrorCode_ptr *in_stack_ffffffffffffffa0;
  raii_casemap *in_stack_ffffffffffffffa8;
  
  cvt_type = (cpcvt_type)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  if (in_EDX == 0) {
    charset = (string *)&local_81;
    piVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"UTF-8",(allocator *)charset);
    icu_std_converter<char,_1>::icu_std_converter(in_RDI,charset,cvt_type);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    icu_std_converter<char,_1>::icu
              (in_stack_ffffffffffffff38,(char_type *)in_stack_ffffffffffffff30,
               (char_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    anon_unknown_12::normalize_string(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    icu_std_converter<char,1>::std_abi_cxx11_(piVar1,(UnicodeString *)in_RDI);
    icu_70::UnicodeString::~UnicodeString((UnicodeString *)&stack0xffffffffffffff28);
    icu_std_converter<char,_1>::~icu_std_converter((icu_std_converter<char,_1> *)0x263c85);
    in_RDI = piVar1;
  }
  else {
    switch(in_EDX) {
    case 1:
      raii_casemap::convert<int(*)(UCaseMap_const*,char*,int,char_const*,int,UErrorCode*)>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)in_stack_ffffffffffffff90);
      break;
    case 2:
      raii_casemap::convert<int(*)(UCaseMap_const*,char*,int,char_const*,int,UErrorCode*)>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)in_stack_ffffffffffffff90);
      break;
    case 3:
      raii_casemap::convert<int(*)(UCaseMap_const*,char*,int,char_const*,int,UErrorCode*)>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)in_stack_ffffffffffffff90);
      break;
    case 4:
      raii_casemap::raii_casemap(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      raii_casemap::convert<int(*)(UCaseMap*,char*,int,char_const*,int,UErrorCode*)>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)in_stack_ffffffffffffff90);
      raii_casemap::~raii_casemap((raii_casemap *)0x263def);
      break;
    default:
      piVar1 = in_RDI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)in_RDI,in_RCX,in_R8 - (long)in_RCX,(allocator *)&stack0xffffffffffffff1f)
      ;
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
      in_RDI = piVar1;
    }
  }
  return (string *)in_RDI;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int flags = 0) const
        {
            
            if(how == converter_base::normalization) {
                icu_std_converter<char> cvt("UTF-8");
                icu::UnicodeString str=cvt.icu(begin,end);
                normalize_string(str,flags);
                return cvt.std(str);
            }
            
            switch(how) 
            {
            case converter_base::upper_case:
                return map_.convert(ucasemap_utf8ToUpper,begin,end);
            case converter_base::lower_case:
                return map_.convert(ucasemap_utf8ToLower,begin,end);
            case converter_base::title_case:
                {
                    // Non-const method, so need to create a separate map
                    raii_casemap map(locale_id_);
                    return map.convert(ucasemap_utf8ToTitle,begin,end);
                }
            case converter_base::case_folding:
                return map_.convert(ucasemap_utf8FoldCase,begin,end);
            default:
                return std::string(begin,end-begin);
            }
        }